

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

bool deqp::gls::BuiltinPrecisionTests::inputLess<tcu::Vector<float,2>>
               (Vector<float,_2> *val1,Vector<float,_2> *val2)

{
  bool bVar1;
  InputLess<tcu::Vector<float,_2>_> local_1;
  
  bVar1 = InputLess<tcu::Vector<float,_2>_>::operator()(&local_1,val1,val2);
  return bVar1;
}

Assistant:

bool inputLess (const T& val1, const T& val2)
{
	return InputLess<T>()(val1, val2);
}